

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O3

int ON_ArePointsOnPlane(int dim,bool is_rat,int count,int stride,double *point,ON_BoundingBox *bbox,
                       ON_Plane *plane,double tolerance)

{
  ON_3dPoint p;
  ON_3dPoint p_00;
  ON_3dPoint p_01;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ON_3dPoint *pOVar4;
  undefined8 uVar5;
  char *sFormat;
  byte bVar6;
  double *pdVar7;
  bool bVar8;
  int iVar9;
  double dVar10;
  ON_3dPoint Q;
  double local_90;
  int local_84;
  ON_3dVector local_78;
  undefined4 local_5c;
  ulong local_58;
  double *local_50;
  ON_3dPoint local_48;
  
  if (0 < count) {
    bVar1 = ON_Plane::IsValid(plane);
    if (bVar1) {
      bVar1 = ON_BoundingBox::IsValid(bbox);
      if (bVar1) {
        bVar1 = ON_IsValid(tolerance);
        if (tolerance < 0.0 || !bVar1) {
          sFormat = "tolerance must be >= 0.0";
          iVar2 = 0x232;
        }
        else if (dim - 4U < 0xfffffffe) {
          sFormat = "dim must be 2 or 3";
          iVar2 = 0x237;
        }
        else if (stride < (int)((uint)is_rat + dim)) {
          sFormat = "stride parameter is too small";
          iVar2 = 0x23c;
        }
        else if (point == (double *)0x0) {
          sFormat = "point parameter is null";
          iVar2 = 0x241;
        }
        else {
          local_90 = tolerance;
          if ((tolerance == 0.0) && (!NAN(tolerance))) {
            local_90 = ON_BoundingBox::Tolerance(bbox);
          }
          uVar3 = 2;
          local_58 = (ulong)(uint)dim;
          local_50 = point;
          if (count != 1) {
            ON_BoundingBox::Diagonal(&local_78,bbox);
            dVar10 = ON_3dVector::Length(&local_78);
            uVar3 = (ulong)(2 - (local_90 < dVar10));
          }
          iVar2 = 0;
          uVar5 = CONCAT71((int7)(uVar3 >> 8),1);
          do {
            local_5c = (undefined4)uVar5;
            pOVar4 = ON_BoundingBox::operator[](bbox,iVar2);
            local_78.x = pOVar4->x;
            bVar6 = 1;
            iVar2 = 0;
            do {
              pOVar4 = ON_BoundingBox::operator[](bbox,iVar2);
              local_78.y = pOVar4->y;
              iVar2 = 0;
              bVar1 = true;
              do {
                bVar8 = bVar1;
                pOVar4 = ON_BoundingBox::operator[](bbox,iVar2);
                local_78.z = pOVar4->z;
                p.y = local_78.y;
                p.x = local_78.x;
                p.z = local_78.z;
                ON_Plane::ClosestPointTo(&local_48,plane,p);
                dVar10 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_78,&local_48);
                if (local_90 < dVar10) break;
                iVar2 = 1;
                bVar1 = false;
              } while (bVar8);
              iVar2 = 1;
              bVar1 = (bool)(dVar10 <= local_90 & bVar6);
              bVar6 = 0;
            } while (bVar1);
            uVar5 = 0;
          } while (((byte)local_5c & dVar10 <= local_90) != 0);
          if (dVar10 <= local_90) {
            return (int)uVar3;
          }
          local_78.z = ON_3dPoint::Origin.z;
          local_78.x = ON_3dPoint::Origin.x;
          local_78.y = ON_3dPoint::Origin.y;
          iVar2 = 2;
          if (count != 1) {
            ON_BoundingBox::Diagonal((ON_3dVector *)&local_48,bbox);
            dVar10 = ON_3dVector::Length((ON_3dVector *)&local_48);
            iVar2 = 2 - (uint)(local_90 < dVar10);
          }
          iVar9 = (int)local_58;
          local_84 = count;
          if (!is_rat) {
            pdVar7 = local_50;
            do {
              memcpy((ON_3dPoint *)&local_78,pdVar7,(ulong)(uint)(iVar9 << 3));
              p_01.y = local_78.y;
              p_01.x = local_78.x;
              p_01.z = local_78.z;
              ON_Plane::ClosestPointTo(&local_48,plane,p_01);
              dVar10 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_78,&local_48);
              if (local_90 < dVar10) {
                return 0;
              }
              pdVar7 = pdVar7 + (uint)stride;
              local_84 = local_84 + -1;
            } while (local_84 != 0);
            return iVar2;
          }
          uVar3 = local_58 & 0xffffffff;
          pdVar7 = local_50;
          while( true ) {
            dVar10 = pdVar7[uVar3];
            if ((dVar10 == 0.0) && (!NAN(dVar10))) break;
            ON_ArrayScale((int)local_58,1.0 / dVar10,pdVar7,(double *)&local_78);
            p_00.y = local_78.y;
            p_00.x = local_78.x;
            p_00.z = local_78.z;
            ON_Plane::ClosestPointTo(&local_48,plane,p_00);
            dVar10 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_78,&local_48);
            if (local_90 < dVar10) {
              return 0;
            }
            pdVar7 = pdVar7 + (uint)stride;
            local_84 = local_84 + -1;
            if (local_84 == 0) {
              return iVar2;
            }
          }
          sFormat = "rational point has zero weight";
          iVar2 = 0x263;
        }
      }
      else {
        sFormat = "bbox parameter is not valid";
        iVar2 = 0x22d;
      }
    }
    else {
      sFormat = "plane parameter is not valid";
      iVar2 = 0x228;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_plane.cpp"
               ,iVar2,"",sFormat);
  }
  return 0;
}

Assistant:

int ON_ArePointsOnPlane( // returns 0=no, 1 = yes, 2 = pointset is (to tolerance) a single point on the line
        int dim,     // 2 or 3
        bool is_rat,
        int count, 
        int stride, const double* point,
        const ON_BoundingBox& bbox, // if needed, use ON_GetBoundingBox(dim,is_rat,count,stride,point)
        const ON_Plane& plane,  // line to test
        double tolerance
        )
{
  double w;
  int i, j, k;

  if ( count < 1 )
    return 0;
  if ( !plane.IsValid() )
  {
    ON_ERROR("plane parameter is not valid");
    return 0;
  }
  if ( !bbox.IsValid() )
  {
    ON_ERROR("bbox parameter is not valid");
    return 0;
  }
  if ( !ON_IsValid(tolerance) || tolerance < 0.0 )
  {
    ON_ERROR("tolerance must be >= 0.0");
    return 0;
  }
  if ( dim < 2 || dim > 3 )
  {
    ON_ERROR("dim must be 2 or 3");
    return 0;
  }
  if ( stride < (is_rat?(dim+1):dim) )
  {
    ON_ERROR("stride parameter is too small");
    return 0;
  }
  if ( 0 == point )
  {
    ON_ERROR("point parameter is null");
    return 0;
  }

  int rc = 0;

  if ( tolerance == 0.0 ) {
    tolerance = bbox.Tolerance();
  }

  ON_3dPoint Q;

  // test bounding box to quickly detect the common coordinate axis cases
  rc = (count == 1 || bbox.Diagonal().Length() <= tolerance) ? 2 : 1;
  for ( i = 0; rc && i < 2; i++ ) {
    Q.x = bbox[i].x;
    for ( j = 0; rc && j < 2; j++) {
      Q.y = bbox[j].y;
      for ( k = 0; rc && k < 2; k++) {
        Q.z = bbox[k].z;
        if ( Q.DistanceTo( plane.ClosestPointTo( Q ) ) > tolerance )
          rc = 0;
      }
    }
  }

  if ( !rc ) {
    // test points one by one
    Q = ON_3dPoint::Origin;
    rc = (count == 1 || bbox.Diagonal().Length() <= tolerance) ? 2 : 1;
    if ( is_rat ) {
      for ( i = 0; i < count; i++ ) {
        w = point[dim];
        if ( w == 0.0 ) {
          ON_ERROR("rational point has zero weight");
          return 0;
        }
        ON_ArrayScale( dim, 1.0/w, point, &Q.x );
        if ( Q.DistanceTo( plane.ClosestPointTo( Q ) ) > tolerance ) {
          rc = 0;
          break;
        }
        point += stride;
      }
    }
    else {
      for ( i = 0; i < count; i++ ) {
        memcpy( &Q.x, point, dim*sizeof(Q.x) );
        if ( Q.DistanceTo( plane.ClosestPointTo( Q ) ) > tolerance ) {
          rc = 0;
          break;
        }
        point += stride;
      }
    }
  }

  return rc;
}